

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
FastVector<RegVmCmd,_false,_false>::grow_no_destroy
          (FastVector<RegVmCmd,_false,_false> *this,uint newSize)

{
  uint uVar1;
  RegVmCmd *__s;
  uint uVar2;
  
  uVar2 = (this->max >> 1) + this->max;
  uVar1 = newSize + 0x20;
  if (newSize < uVar2) {
    uVar1 = uVar2;
  }
  __s = (RegVmCmd *)(*(code *)NULLC::alloc)(uVar1 * 8 + 4);
  if (uVar1 != 0) {
    memset(__s,0,(long)(int)uVar1 << 3);
  }
  if (__s != (RegVmCmd *)0x0) {
    if (this->data != (RegVmCmd *)0x0) {
      NULLC::copyMemory(__s,this->data,(ulong)this->max << 3);
    }
    this->data = __s;
    this->max = uVar1;
    return;
  }
  __assert_fail("newData",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0xa7,
                "void FastVector<RegVmCmd>::grow_no_destroy(unsigned int) [T = RegVmCmd, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void grow_no_destroy(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 32;

		T* newData;

		if(!skipConstructor)
			newData = NULLC::construct<T>(newSize);
		else
			newData = (T*)NULLC::alignedAlloc(sizeof(T) * newSize);

		assert(newData);

		if(zeroNewMemory)
			NULLC::fillMemory(newData, 0, newSize * sizeof(T));

		if(data)
			NULLC::copyMemory(newData, data, max * sizeof(T));

		data = newData;
		max = newSize;
	}